

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_progress_reporter.cpp
# Opt level: O0

void __thiscall
ON_ProgressReporter::SetSynchronousProgressCallbackFunction
          (ON_ProgressReporter *this,_func_void_ON__UINT_PTR_double *callback_function,
          ON__UINT_PTR callback_context)

{
  ON__UINT_PTR callback_context_local;
  _func_void_ON__UINT_PTR_double *callback_function_local;
  ON_ProgressReporter *this_local;
  
  if (((callback_function == (_func_void_ON__UINT_PTR_double *)0x0) ||
      (this->m_callback_function != callback_function)) ||
     (this->m_callback_context != callback_context)) {
    this->m_callback_context = callback_context;
    this->m_callback_function = callback_function;
    this->m_previous_callback_fraction_complete = -1.0;
  }
  return;
}

Assistant:

void ON_ProgressReporter::SetSynchronousProgressCallbackFunction(
  void (*callback_function)(ON__UINT_PTR context,double fraction_complete),
  ON__UINT_PTR callback_context
  )
{
  if (    0 == callback_function
       || m_callback_function != callback_function
       || m_callback_context != callback_context
     )
  {
    m_callback_context = callback_context;
    m_callback_function = callback_function;
    m_previous_callback_fraction_complete = -1.0; // any value <= -1.0 will work
  }
}